

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  bool local_29;
  uint MinNonEmpty;
  SmallPtrSetImplBase *RHS_local;
  SmallPtrSetImplBase *this_local;
  
  if (this != RHS) {
    bVar2 = isSmall(this);
    if ((bVar2) || (bVar2 = isSmall(RHS), bVar2)) {
      bVar2 = isSmall(this);
      if ((bVar2) || (bVar2 = isSmall(RHS), !bVar2)) {
        bVar2 = isSmall(this);
        if ((!bVar2) || (bVar2 = isSmall(RHS), bVar2)) {
          bVar2 = isSmall(this);
          local_29 = false;
          if (bVar2) {
            local_29 = isSmall(RHS);
          }
          if (local_29 == false) {
            __assert_fail("this->isSmall() && RHS.isSmall()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                          ,0x100,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
          }
          puVar3 = std::min<unsigned_int>(&this->NumNonEmpty,&RHS->NumNonEmpty);
          uVar1 = *puVar3;
          std::swap_ranges<void_const**,void_const**>
                    (this->SmallArray,this->SmallArray + uVar1,RHS->SmallArray);
          if (uVar1 < this->NumNonEmpty) {
            std::copy<void_const**,void_const**>
                      (this->SmallArray + uVar1,this->SmallArray + this->NumNonEmpty,
                       RHS->SmallArray + uVar1);
          }
          else {
            std::copy<void_const**,void_const**>
                      (RHS->SmallArray + uVar1,RHS->SmallArray + RHS->NumNonEmpty,
                       this->SmallArray + uVar1);
          }
          if (this->CurArraySize != RHS->CurArraySize) {
            __assert_fail("this->CurArraySize == RHS.CurArraySize",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                          ,0x10c,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
          }
          std::swap<unsigned_int>(&this->NumNonEmpty,&RHS->NumNonEmpty);
          std::swap<unsigned_int>(&this->NumTombstones,&RHS->NumTombstones);
        }
        else {
          if (this->CurArray != this->SmallArray) {
            __assert_fail("this->CurArray == this->SmallArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                          ,0xf4,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
          }
          std::copy<void_const**,void_const**>
                    (this->CurArray,this->CurArray + this->NumNonEmpty,RHS->SmallArray);
          std::swap<unsigned_int>(&RHS->CurArraySize,&this->CurArraySize);
          std::swap<unsigned_int>(&RHS->NumNonEmpty,&this->NumNonEmpty);
          std::swap<unsigned_int>(&RHS->NumTombstones,&this->NumTombstones);
          this->CurArray = RHS->CurArray;
          RHS->CurArray = RHS->SmallArray;
        }
      }
      else {
        if (RHS->CurArray != RHS->SmallArray) {
          __assert_fail("RHS.CurArray == RHS.SmallArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                        ,0xe7,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
        }
        std::copy<void_const**,void_const**>
                  (RHS->CurArray,RHS->CurArray + RHS->NumNonEmpty,this->SmallArray);
        std::swap<unsigned_int>(&RHS->CurArraySize,&this->CurArraySize);
        std::swap<unsigned_int>(&this->NumNonEmpty,&RHS->NumNonEmpty);
        std::swap<unsigned_int>(&this->NumTombstones,&RHS->NumTombstones);
        RHS->CurArray = this->CurArray;
        this->CurArray = this->SmallArray;
      }
    }
    else {
      std::swap<void_const**>(&this->CurArray,&RHS->CurArray);
      std::swap<unsigned_int>(&this->CurArraySize,&RHS->CurArraySize);
      std::swap<unsigned_int>(&this->NumNonEmpty,&RHS->NumNonEmpty);
      std::swap<unsigned_int>(&this->NumTombstones,&RHS->NumTombstones);
    }
  }
  return;
}

Assistant:

void SmallPtrSetImplBase::swap(SmallPtrSetImplBase &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither set is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->CurArray, RHS.CurArray);
    std::swap(this->CurArraySize, RHS.CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    return;
  }

  // FIXME: From here on we assume that both sets have the same small size.

  // If only RHS is small, copy the small elements into LHS and move the pointer
  // from LHS to RHS.
  if (!this->isSmall() && RHS.isSmall()) {
    assert(RHS.CurArray == RHS.SmallArray);
    std::copy(RHS.CurArray, RHS.CurArray + RHS.NumNonEmpty, this->SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    RHS.CurArray = this->CurArray;
    this->CurArray = this->SmallArray;
    return;
  }

  // If only LHS is small, copy the small elements into RHS and move the pointer
  // from RHS to LHS.
  if (this->isSmall() && !RHS.isSmall()) {
    assert(this->CurArray == this->SmallArray);
    std::copy(this->CurArray, this->CurArray + this->NumNonEmpty,
              RHS.SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(RHS.NumNonEmpty, this->NumNonEmpty);
    std::swap(RHS.NumTombstones, this->NumTombstones);
    this->CurArray = RHS.CurArray;
    RHS.CurArray = RHS.SmallArray;
    return;
  }

  // Both a small, just swap the small elements.
  assert(this->isSmall() && RHS.isSmall());
  unsigned MinNonEmpty = std::min(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap_ranges(this->SmallArray, this->SmallArray + MinNonEmpty,
                   RHS.SmallArray);
  if (this->NumNonEmpty > MinNonEmpty) {
    std::copy(this->SmallArray + MinNonEmpty,
              this->SmallArray + this->NumNonEmpty,
              RHS.SmallArray + MinNonEmpty);
  } else {
    std::copy(RHS.SmallArray + MinNonEmpty, RHS.SmallArray + RHS.NumNonEmpty,
              this->SmallArray + MinNonEmpty);
  }
  assert(this->CurArraySize == RHS.CurArraySize);
  std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap(this->NumTombstones, RHS.NumTombstones);
}